

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_lib.cc
# Opt level: O2

bool bssl::tls_new(SSL *ssl)

{
  _Head_base<0UL,_bssl::SSL3_STATE_*,_false> _Var1;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> _Var2;
  int iVar3;
  pointer __p;
  bool bVar4;
  UniquePtr<SSL3_STATE> s3;
  _Head_base<0UL,_bssl::SSL3_STATE_*,_false> local_20;
  _Head_base<0UL,_bssl::SSLAEADContext_*,_false> local_18;
  
  local_20._M_head_impl = New<bssl::SSL3_STATE>();
  if (local_20._M_head_impl != (SSL3_STATE *)0x0) {
    iVar3 = SSL_is_dtls(ssl);
    if (iVar3 == 0) {
      SSLAEADContext::CreateNullCipher();
      _Var2._M_head_impl = local_18._M_head_impl;
      local_18._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                 &(local_20._M_head_impl)->aead_read_ctx,_Var2._M_head_impl);
      std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_18);
      SSLAEADContext::CreateNullCipher();
      _Var2._M_head_impl = local_18._M_head_impl;
      local_18._M_head_impl = (SSLAEADContext *)0x0;
      std::__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter> *)
                 &(local_20._M_head_impl)->aead_write_ctx,_Var2._M_head_impl);
      std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter> *)&local_18);
      if ((((local_20._M_head_impl)->aead_read_ctx)._M_t.
           super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl ==
           (SSLAEADContext *)0x0) ||
         (((local_20._M_head_impl)->aead_write_ctx)._M_t.
          super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl == (SSLAEADContext *)0x0
         )) goto LAB_00146679;
    }
    ssl_handshake_new((bssl *)&local_18,ssl);
    _Var2._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (SSLAEADContext *)0x0;
    std::__uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
               &(local_20._M_head_impl)->hs,(pointer)_Var2._M_head_impl);
    std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)&local_18);
    _Var1._M_head_impl = local_20._M_head_impl;
    if (((local_20._M_head_impl)->hs)._M_t.
        super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl != (SSL_HANDSHAKE *)0x0) {
      local_20._M_head_impl = (SSL3_STATE *)0x0;
      ssl->s3 = _Var1._M_head_impl;
      bVar4 = true;
      goto LAB_0014667b;
    }
  }
LAB_00146679:
  bVar4 = false;
LAB_0014667b:
  std::unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bssl::SSL3_STATE,_bssl::internal::Deleter> *)&local_20);
  return bVar4;
}

Assistant:

bool tls_new(SSL *ssl) {
  UniquePtr<SSL3_STATE> s3 = MakeUnique<SSL3_STATE>();
  if (!s3) {
    return false;
  }

  // TODO(crbug.com/368805255): Fields that aren't used in DTLS should not be
  // allocated at all.
  // TODO(crbug.com/371998381): Don't create these in QUIC either, once the
  // placeholder QUIC ones for subsequent epochs are removed.
  if (!SSL_is_dtls(ssl)) {
    s3->aead_read_ctx = SSLAEADContext::CreateNullCipher();
    s3->aead_write_ctx = SSLAEADContext::CreateNullCipher();
    if (!s3->aead_read_ctx || !s3->aead_write_ctx) {
      return false;
    }
  }

  s3->hs = ssl_handshake_new(ssl);
  if (!s3->hs) {
    return false;
  }

  ssl->s3 = s3.release();
  return true;
}